

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_pack(REF_GEOM ref_geom,REF_INT *o2n)

{
  REF_INT *pRVar1;
  REF_DBL *pRVar2;
  int iVar3;
  REF_INT RVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  int *piVar9;
  long lVar10;
  ulong uVar11;
  char *pcVar12;
  long lVar13;
  
  lVar6 = 0;
  lVar7 = 0;
  lVar10 = 0;
  iVar3 = 0;
  while( true ) {
    uVar11 = (ulong)ref_geom->max;
    if ((long)uVar11 <= lVar10) break;
    pRVar1 = ref_geom->descr;
    if (pRVar1[lVar10 * 6] != -1) {
      for (lVar13 = 0; lVar13 != 6; lVar13 = lVar13 + 1) {
        pRVar1[iVar3 * 6 + lVar13] = *(REF_INT *)((long)pRVar1 + lVar13 * 4 + lVar7);
      }
      pRVar1[(long)(iVar3 * 6) + 5] = o2n[pRVar1[lVar10 * 6 + 5]];
      pRVar2 = ref_geom->param;
      for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
        pRVar2[iVar3 * 2 + lVar13] = *(REF_DBL *)((long)pRVar2 + lVar13 * 8 + lVar6);
      }
      iVar3 = iVar3 + 1;
    }
    lVar10 = lVar10 + 1;
    lVar7 = lVar7 + 0x18;
    lVar6 = lVar6 + 0x10;
  }
  if (iVar3 == ref_geom->n) {
    if (iVar3 < ref_geom->max) {
      lVar6 = (long)iVar3;
      pRVar1 = ref_geom->descr;
      piVar9 = pRVar1 + lVar6 * 6 + 1;
      while( true ) {
        iVar3 = iVar3 + 1;
        if ((int)uVar11 <= lVar6) break;
        piVar9[-1] = -1;
        lVar6 = lVar6 + 1;
        *piVar9 = iVar3;
        uVar11 = (ulong)(uint)ref_geom->max;
        piVar9 = piVar9 + 6;
      }
      pRVar1[(int)uVar11 * 6 + -5] = -1;
      RVar4 = ref_geom->n;
    }
    else {
      RVar4 = -1;
    }
    ref_geom->blank = RVar4;
    uVar5 = ref_adj_free(ref_geom->ref_adj);
    if (uVar5 == 0) {
      uVar5 = ref_adj_create(&ref_geom->ref_adj);
      if (uVar5 == 0) {
        lVar7 = 0;
        lVar6 = 0;
        while( true ) {
          if (ref_geom->max <= lVar6) {
            return 0;
          }
          if ((*(int *)((long)ref_geom->descr + lVar7) != -1) &&
             (uVar5 = ref_adj_add(ref_geom->ref_adj,
                                  *(REF_INT *)((long)ref_geom->descr + lVar7 + 0x14),(REF_INT)lVar6)
             , uVar5 != 0)) break;
          lVar6 = lVar6 + 1;
          lVar7 = lVar7 + 0x18;
        }
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xf5
               ,"ref_geom_pack",(ulong)uVar5,"register geom");
        return uVar5;
      }
      pcVar12 = "create ref_adj for ref_geom";
      uVar8 = 0xf1;
    }
    else {
      pcVar12 = "free to prevent leak";
      uVar8 = 0xf0;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar8,
           "ref_geom_pack",(ulong)uVar5,pcVar12);
  }
  else {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xe5,
           "ref_geom_pack","count mismatch",(long)iVar3,(long)ref_geom->n);
    uVar5 = 1;
  }
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_geom_pack(REF_GEOM ref_geom, REF_INT *o2n) {
  REF_INT geom, compact, i;
  compact = 0;
  each_ref_geom(ref_geom, geom) {
    for (i = 0; i < REF_GEOM_DESCR_SIZE; i++)
      ref_geom_descr(ref_geom, i, compact) = ref_geom_descr(ref_geom, i, geom);
    ref_geom_node(ref_geom, compact) = o2n[ref_geom_node(ref_geom, geom)];
    for (i = 0; i < 2; i++)
      ref_geom_param(ref_geom, i, compact) = ref_geom_param(ref_geom, i, geom);
    compact++;
  }
  REIS(compact, ref_geom_n(ref_geom), "count mismatch");
  if (ref_geom_n(ref_geom) < ref_geom_max(ref_geom)) {
    for (geom = ref_geom_n(ref_geom); geom < ref_geom_max(ref_geom); geom++) {
      ref_geom_type(ref_geom, geom) = REF_EMPTY;
      ref_geom_id(ref_geom, geom) = geom + 1;
    }
    ref_geom_id(ref_geom, ref_geom_max(ref_geom) - 1) = REF_EMPTY;
    ref_geom_blank(ref_geom) = ref_geom_n(ref_geom);
  } else {
    ref_geom_blank(ref_geom) = REF_EMPTY;
  }
  RSS(ref_adj_free(ref_geom->ref_adj), "free to prevent leak");
  RSS(ref_adj_create(&(ref_geom->ref_adj)), "create ref_adj for ref_geom");

  each_ref_geom(ref_geom, geom) {
    RSS(ref_adj_add(ref_geom->ref_adj, ref_geom_node(ref_geom, geom), geom),
        "register geom");
  }

  return REF_SUCCESS;
}